

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O2

int zt_base_encode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  byte *pbVar21;
  long lStack_50;
  
  if (out == (void **)0x0) {
    pvVar12 = (void *)0x0;
  }
  else {
    pvVar12 = *out;
  }
  iVar10 = _valid_dictionary_p(def);
  if (out_bytes == (size_t *)0x0) {
    return -1;
  }
  if (iVar10 == 0) {
    return -1;
  }
  if (in == (void *)0x0 || in_bytes == 0) {
    *out_bytes = 0;
    return 0;
  }
  uVar11 = in_bytes / def->igroups;
  uVar13 = (int)(in_bytes % (ulong)def->igroups) << 3;
  uVar20 = uVar11 * def->ogroups;
  if ((ushort)def->obits <= uVar13) {
    if ((def->flags & zt_base_encode_with_padding) == 0) {
      uVar20 = uVar20 + (ushort)(uVar13 / (ushort)def->obits) + 1;
    }
    else {
      uVar20 = uVar20 + def->ogroups;
    }
  }
  uVar14 = *out_bytes;
  if (pvVar12 == (void *)0x0 && out != (void **)0x0) {
    if (uVar14 != 0) {
      pvVar12 = (void *)0x0;
      goto LAB_00122bed;
    }
    pvVar12 = zt_calloc_p(uVar20,1);
    *out = pvVar12;
    *out_bytes = uVar20;
  }
  else {
LAB_00122bed:
    *out_bytes = uVar20;
    if (uVar14 < uVar20) {
      return -2;
    }
  }
  if (out == (void **)0x0) {
    return 0;
  }
  if (pvVar12 == (void *)0x0) {
    return 0;
  }
  sVar6 = def->base;
  if (sVar6 == 0x10) {
    pcVar7 = def->alphabet;
    for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
      bVar1 = *(byte *)((long)in + uVar20);
      *(char *)((long)pvVar12 + uVar20 * 2) = pcVar7[bVar1 >> 4];
      *(char *)((long)pvVar12 + uVar20 * 2 + 1) = pcVar7[bVar1 & 0xf];
    }
    return 0;
  }
  if (sVar6 != 0x20) {
    if (sVar6 != 0x40) {
      return -1;
    }
    bVar1 = def->igroups;
    pcVar7 = def->alphabet;
    cVar2 = def->pad;
    pbVar21 = (byte *)((long)in + 2);
    lVar18 = 0;
    for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
      bVar17 = pbVar21[-2];
      bVar16 = pbVar21[-1];
      bVar3 = *pbVar21;
      *(char *)((long)pvVar12 + uVar20 * 4) = pcVar7[bVar17 >> 2];
      *(char *)((long)pvVar12 + uVar20 * 4 + 1) = pcVar7[(uint)(bVar16 >> 4) | (bVar17 & 3) << 4];
      *(char *)((long)pvVar12 + uVar20 * 4 + 2) = pcVar7[(uint)(bVar3 >> 6) + (bVar16 & 0xf) * 4];
      *(char *)((long)pvVar12 + uVar20 * 4 + 3) = pcVar7[bVar3 & 0x3f];
      lVar18 = lVar18 + -4;
      pbVar21 = pbVar21 + 3;
    }
    uVar11 = in_bytes % (ulong)bVar1;
    if (uVar11 != 0) {
      bVar1 = pbVar21[-2];
      uVar14 = 0;
      if (uVar11 != 1) {
        uVar14 = (ulong)pbVar21[-1];
      }
      *(char *)((long)pvVar12 + uVar20 * 4) = pcVar7[bVar1 >> 2];
      *(char *)((long)pvVar12 + uVar20 * 4 + 1) = pcVar7[(uint)(uVar14 >> 4) | (bVar1 & 3) << 4];
      if (uVar11 == 1) {
        lVar18 = 2 - lVar18;
      }
      else {
        lVar18 = 3 - lVar18;
        *(char *)((long)pvVar12 + uVar20 * 4 + 2) = pcVar7[(ulong)((uint)uVar14 & 0xf) * 4];
      }
      if ((def->flags & zt_base_encode_with_padding) == 0) {
        return 0;
      }
      for (lVar15 = 0; 3 - uVar11 != lVar15; lVar15 = lVar15 + 1) {
        *(char *)((long)pvVar12 + lVar15 + lVar18) = cVar2;
      }
      return 0;
    }
    return 0;
  }
  bVar1 = def->igroups;
  pcVar7 = def->alphabet;
  pbVar21 = (byte *)((long)in + 4);
  lVar18 = 0;
  for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
    bVar17 = pbVar21[-4];
    bVar16 = pbVar21[-3];
    bVar3 = pbVar21[-2];
    bVar4 = pbVar21[-1];
    bVar5 = *pbVar21;
    *(char *)((long)pvVar12 + uVar20 * 8) = pcVar7[bVar17 >> 3];
    *(char *)((long)pvVar12 + uVar20 * 8 + 1) = pcVar7[(uint)(bVar16 >> 6) + (bVar17 & 7) * 4];
    *(char *)((long)pvVar12 + uVar20 * 8 + 2) = pcVar7[bVar16 >> 1 & 0x1f];
    *(char *)((long)pvVar12 + uVar20 * 8 + 3) = pcVar7[(uint)(bVar3 >> 4) | (bVar16 & 1) << 4];
    *(char *)((long)pvVar12 + uVar20 * 8 + 4) = pcVar7[(uint)(bVar4 >> 7) + (bVar3 & 0xf) * 2];
    *(char *)((long)pvVar12 + uVar20 * 8 + 5) = pcVar7[bVar4 >> 2 & 0x1f];
    *(char *)((long)pvVar12 + uVar20 * 8 + 6) = pcVar7[(uint)(bVar5 >> 5) + (bVar4 & 3) * 8];
    *(char *)((long)pvVar12 + uVar20 * 8 + 7) = pcVar7[bVar5 & 0x1f];
    lVar18 = lVar18 + -8;
    pbVar21 = pbVar21 + 5;
  }
  uVar11 = in_bytes % (ulong)bVar1;
  if (uVar11 == 0) {
    return 0;
  }
  bVar1 = pbVar21[-4];
  bVar9 = false;
  bVar16 = 0;
  bVar17 = 0;
  bVar8 = false;
  uVar14 = 0;
  if (uVar11 != 1) {
    bVar17 = pbVar21[-3];
    if (uVar11 < 3) {
      bVar16 = 0;
      bVar8 = false;
    }
    else {
      bVar16 = pbVar21[-2];
      if (uVar11 != 3) {
        uVar14 = (ulong)pbVar21[-1];
        bVar9 = true;
        bVar8 = true;
        goto LAB_00122f02;
      }
      bVar8 = true;
    }
    bVar9 = false;
    uVar14 = 0;
  }
LAB_00122f02:
  *(char *)((long)pvVar12 + uVar20 * 8) = pcVar7[bVar1 >> 3];
  *(char *)((long)pvVar12 + uVar20 * 8 + 1) = pcVar7[(uint)(bVar17 >> 6) + (bVar1 & 7) * 4];
  if (uVar11 == 1) {
    lVar18 = 2 - lVar18;
    lStack_50 = 6;
  }
  else {
    *(char *)((long)pvVar12 + uVar20 * 8 + 2) = pcVar7[bVar17 >> 1 & 0x1f];
    lVar18 = 4 - lVar18;
    *(char *)((long)pvVar12 + uVar20 * 8 + 3) = pcVar7[(uint)(bVar16 >> 4) | (bVar17 & 1) << 4];
    lStack_50 = 4;
  }
  pcVar19 = (char *)((long)pvVar12 + lVar18);
  if (bVar8) {
    *pcVar19 = pcVar7[((uint)uVar14 >> 7) + (bVar16 & 0xf) * 2];
    pcVar19 = pcVar19 + 1;
    lStack_50 = 3;
  }
  if (bVar9) {
    *pcVar19 = pcVar7[(uint)(uVar14 >> 2) & 0x1f];
    pcVar19[1] = pcVar7[(ulong)((uint)uVar14 & 3) * 8];
    pcVar19 = pcVar19 + 2;
    lStack_50 = 1;
  }
  if ((def->flags & zt_base_encode_with_padding) == 0) {
    return 0;
  }
  for (lVar18 = 0; lStack_50 != lVar18; lVar18 = lVar18 + 1) {
    pcVar19[lVar18] = def->pad;
  }
  return 0;
}

Assistant:

int
zt_base_encode(zt_base_definition_t * def, const void * in, size_t in_bytes, void **out, size_t *out_bytes) {
    size_t                ocount;
    size_t                lcount;
    size_t                mod;
    size_t                olen;
    const unsigned char * inp = in;
    unsigned char       * outp = out ? *(unsigned char **)out : NULL;

    if (! _valid_dictionary_p(def)) {
        return -1;
    }

    /* if we are missing out_bytes then we cannot continue */
    if (!out_bytes) {
        return -1;
    }

    /* if there is no input then we cannot continue */
    if(!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    /* calculate the number of (N * 8-bit) input groups and remainder */
    lcount = in_bytes / def->igroups;                        /* number of whole input groups */
    mod = ((8 * (in_bytes % def->igroups)) / def->obits);    /* portion of partial output groups */
    ocount = (lcount * def->ogroups);                        /* number of whole output groups */

    if (mod > 0) {
        if ZT_BIT_ISSET(def->flags, zt_base_encode_with_padding) {
            ocount += def->ogroups;
        } else {
            ocount += mod + 1;
        }
    }